

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::SortByMaterials_3DGS_MDL7
          (MDLImporter *this,IntGroupInfo_MDL7 *groupInfo,IntGroupData_MDL7 *groupData,
          IntSplitGroupData_MDL7 *splitGroupData)

{
  IntSharedData_MDL7 *pIVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  size_type sVar5;
  ulong uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **ppvVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  reference pvVar9;
  Logger *pLVar10;
  reference ppvVar11;
  reference pIVar12;
  aiMaterial *paVar13;
  reference ppaVar14;
  size_type sVar15;
  reference pvVar16;
  uint local_cc;
  uint local_c8;
  uint m_2;
  uint o_1;
  uint o;
  undefined1 local_b8 [8];
  IntMaterial_MDL7 sHelper;
  __normal_iterator<Assimp::MDL::IntMaterial_MDL7_*,_std::vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>_>
  local_a0;
  iterator i;
  uint local_90;
  uint uStack_8c;
  bool bFound;
  uint iNum;
  uint iMatIndex2;
  uint iMatIndex;
  uint iFace_1;
  uint m_1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  aiTempSplit;
  undefined1 local_50 [8];
  vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_> avMats;
  uint local_30;
  uint iFace;
  uint m;
  uint iNumMaterials;
  IntSplitGroupData_MDL7 *splitGroupData_local;
  IntGroupData_MDL7 *groupData_local;
  IntGroupInfo_MDL7 *groupInfo_local;
  MDLImporter *this_local;
  
  sVar5 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                    (&splitGroupData->shared->pcMats);
  uVar4 = (uint)sVar5;
  if ((groupData->bNeed2UV & 1U) == 0) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::clear
              (&groupData->vTextureCoords2);
    uVar6 = SUB168(ZEXT416(uVar4) * ZEXT816(8),0);
    if (SUB168(ZEXT416(uVar4) * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    ppvVar7 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)operator_new__(uVar6);
    splitGroupData->aiSplit = ppvVar7;
    for (local_30 = 0; local_30 < uVar4; local_30 = local_30 + 1) {
      pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      memset(pvVar8,0,0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(pvVar8);
      splitGroupData->aiSplit[local_30] = pvVar8;
    }
    for (avMats.
         super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        avMats.
        super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < (uint)groupInfo->pcGroup->numtris
        ; avMats.
          super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               avMats.
               super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      pvVar9 = std::vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>::
               operator[](&groupData->pcFaces,
                          (ulong)avMats.
                                 super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      if (pvVar9->iMatIndex[0] < uVar4) {
        ppvVar7 = splitGroupData->aiSplit;
        pvVar9 = std::vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                 ::operator[](&groupData->pcFaces,
                              (ulong)avMats.
                                     super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (ppvVar7[pvVar9->iMatIndex[0]],
                   (value_type_conflict1 *)
                   ((long)&avMats.
                           super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      }
      else {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (splitGroupData->aiSplit[uVar4 - 1],
                   (value_type_conflict1 *)
                   ((long)&avMats.
                           super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        pvVar9 = std::vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                 ::operator[](&groupData->pcFaces,
                              (ulong)avMats.
                                     super__Vector_base<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        if (pvVar9->iMatIndex[0] != 0xffffffff) {
          pLVar10 = DefaultLogger::get();
          Logger::warn(pLVar10,"Index overflow in MDL7 material list [#0]");
        }
      }
    }
  }
  else {
    std::vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>::
    vector((vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_> *)
           local_50);
    std::vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>::
    reserve((vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_> *
            )local_50,(ulong)(uVar4 * 2));
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>::allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*> *)
               ((long)&iFace_1 + 3));
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              *)&m_1,(ulong)(uVar4 * 2),
             (allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*> *)
             ((long)&iFace_1 + 3));
    std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>::~allocator
              ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*> *)
               ((long)&iFace_1 + 3));
    for (iMatIndex = 0; iMatIndex < uVar4; iMatIndex = iMatIndex + 1) {
      pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      memset(pvVar8,0,0x18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(pvVar8);
      ppvVar11 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                               *)&m_1,(ulong)iMatIndex);
      *ppvVar11 = pvVar8;
    }
    for (iMatIndex2 = 0; iMatIndex2 < (uint)groupInfo->pcGroup->numtris; iMatIndex2 = iMatIndex2 + 1
        ) {
      pvVar9 = std::vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>::
               operator[](&groupData->pcFaces,(ulong)iMatIndex2);
      iNum = pvVar9->iMatIndex[0];
      if (uVar4 <= iNum) {
        if (iNum != 0xffffffff) {
          pLVar10 = DefaultLogger::get();
          Logger::warn(pLVar10,"Index overflow in MDL7 material list [#1]");
        }
        iNum = uVar4 - 1;
      }
      pvVar9 = std::vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>::
               operator[](&groupData->pcFaces,(ulong)iMatIndex2);
      uStack_8c = pvVar9->iMatIndex[1];
      local_90 = iNum;
      if ((uStack_8c != 0xffffffff) && (iNum != uStack_8c)) {
        if (uVar4 <= uStack_8c) {
          pLVar10 = DefaultLogger::get();
          Logger::warn(pLVar10,"Index overflow in MDL7 material list [#2]");
          uStack_8c = uVar4 - 1;
        }
        local_90 = 0;
        i._M_current._7_1_ = 0;
        local_a0._M_current =
             (IntMaterial_MDL7 *)
             std::
             vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>::
             begin((vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                    *)local_50);
        while( true ) {
          sHelper.iOldMatIndices =
               (uint  [2])
               std::
               vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
               ::end((vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                      *)local_50);
          bVar3 = __gnu_cxx::operator!=
                            (&local_a0,
                             (__normal_iterator<Assimp::MDL::IntMaterial_MDL7_*,_std::vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>_>
                              *)sHelper.iOldMatIndices);
          if (!bVar3) break;
          pIVar12 = __gnu_cxx::
                    __normal_iterator<Assimp::MDL::IntMaterial_MDL7_*,_std::vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>_>
                    ::operator*(&local_a0);
          if ((pIVar12->iOldMatIndices[0] == iNum) &&
             (pIVar12 = __gnu_cxx::
                        __normal_iterator<Assimp::MDL::IntMaterial_MDL7_*,_std::vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>_>
                        ::operator*(&local_a0), pIVar12->iOldMatIndices[1] == uStack_8c)) {
            i._M_current._7_1_ = 1;
            break;
          }
          __gnu_cxx::
          __normal_iterator<Assimp::MDL::IntMaterial_MDL7_*,_std::vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>_>
          ::operator++(&local_a0);
          local_90 = local_90 + 1;
        }
        if ((i._M_current._7_1_ & 1) == 0) {
          MDL::IntMaterial_MDL7::IntMaterial_MDL7((IntMaterial_MDL7 *)local_b8);
          paVar13 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(paVar13);
          sHelper.pcMat._0_4_ = iNum;
          sHelper.pcMat._4_4_ = uStack_8c;
          local_b8 = (undefined1  [8])paVar13;
          ppaVar14 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::operator[]
                               (&splitGroupData->shared->pcMats,(ulong)iNum);
          paVar13 = *ppaVar14;
          ppaVar14 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::operator[]
                               (&splitGroupData->shared->pcMats,(ulong)uStack_8c);
          JoinSkins_3DGS_MDL7(this,paVar13,*ppaVar14,(aiMaterial *)local_b8);
          std::vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
          ::push_back((vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                       *)local_50,(value_type *)local_b8);
          sVar15 = std::
                   vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                   ::size((vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                           *)local_50);
          local_90 = (int)sVar15 - 1;
        }
        sVar15 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                         *)&m_1);
        if (local_90 == sVar15) {
          pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
          (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(pvVar8);
          _o_1 = pvVar8;
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
          ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                       *)&m_1,(value_type *)&o_1);
        }
      }
      ppvVar11 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                               *)&m_1,(ulong)local_90);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(*ppvVar11,&iMatIndex2);
    }
    if (groupInfo->iIndex == 0) {
      pIVar1 = splitGroupData->shared;
      sVar5 = std::
              vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
              ::size((vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                      *)local_50);
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::resize(&pIVar1->pcMats,sVar5);
      for (m_2 = 0; sVar5 = std::
                            vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                            ::size((vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                    *)local_50), m_2 < sVar5; m_2 = m_2 + 1) {
        pvVar16 = std::
                  vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                  ::operator[]((vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                *)local_50,(ulong)m_2);
        paVar13 = pvVar16->pcMat;
        ppaVar14 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::operator[]
                             (&splitGroupData->shared->pcMats,(ulong)m_2);
        *ppaVar14 = paVar13;
      }
    }
    else {
      pIVar1 = splitGroupData->shared;
      sVar15 = std::
               vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
               ::size((vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                       *)local_50);
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::resize
                (&pIVar1->pcMats,(sVar5 & 0xffffffff) + sVar15);
      for (local_c8 = uVar4;
          sVar5 = std::
                  vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                  ::size((vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                          *)local_50), local_c8 < sVar5; local_c8 = local_c8 + 1) {
        pvVar16 = std::
                  vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                  ::operator[]((vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>
                                *)local_50,(ulong)local_c8);
        paVar13 = pvVar16->pcMat;
        ppaVar14 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::operator[]
                             (&splitGroupData->shared->pcMats,(ulong)local_c8);
        *ppaVar14 = paVar13;
      }
    }
    sVar5 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ::size((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                    *)&m_1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = sVar5;
    uVar6 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    ppvVar7 = (vector<unsigned_int,_std::allocator<unsigned_int>_> **)operator_new__(uVar6);
    splitGroupData->aiSplit = ppvVar7;
    for (local_cc = 0; local_cc < uVar4; local_cc = local_cc + 1) {
      ppvVar11 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                               *)&m_1,(ulong)local_cc);
      splitGroupData->aiSplit[local_cc] = *ppvVar11;
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
               *)&m_1);
    std::vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_>::
    ~vector((vector<Assimp::MDL::IntMaterial_MDL7,_std::allocator<Assimp::MDL::IntMaterial_MDL7>_> *
            )local_50);
  }
  return;
}

Assistant:

void MDLImporter::SortByMaterials_3DGS_MDL7(
    const MDL::IntGroupInfo_MDL7&   groupInfo,
    MDL::IntGroupData_MDL7&         groupData,
    MDL::IntSplitGroupData_MDL7& splitGroupData)
{
    const unsigned int iNumMaterials = (unsigned int)splitGroupData.shared.pcMats.size();
    if (!groupData.bNeed2UV)    {
        // if we don't need a second set of texture coordinates there is no reason to keep it in memory ...
        groupData.vTextureCoords2.clear();

        // allocate the array
        splitGroupData.aiSplit = new std::vector<unsigned int>*[iNumMaterials];

        for (unsigned int m = 0; m < iNumMaterials;++m)
            splitGroupData.aiSplit[m] = new std::vector<unsigned int>();

        // iterate through all faces and sort by material
        for (unsigned int iFace = 0; iFace < (unsigned int)groupInfo.pcGroup->numtris;++iFace)  {
            // check range
            if (groupData.pcFaces[iFace].iMatIndex[0] >= iNumMaterials) {
                // use the last material instead
                splitGroupData.aiSplit[iNumMaterials-1]->push_back(iFace);

                // sometimes MED writes -1, but normally only if there is only
                // one skin assigned. No warning in this case
                if(0xFFFFFFFF != groupData.pcFaces[iFace].iMatIndex[0])
                    ASSIMP_LOG_WARN("Index overflow in MDL7 material list [#0]");
            }
            else splitGroupData.aiSplit[groupData.pcFaces[iFace].
                iMatIndex[0]]->push_back(iFace);
        }
    }
    else
    {
        // we need to build combined materials for each combination of
        std::vector<MDL::IntMaterial_MDL7> avMats;
        avMats.reserve(iNumMaterials*2);

        // fixme: why on the heap?
        std::vector<std::vector<unsigned int>* > aiTempSplit(iNumMaterials*2);
        for (unsigned int m = 0; m < iNumMaterials;++m)
            aiTempSplit[m] = new std::vector<unsigned int>();

        // iterate through all faces and sort by material
        for (unsigned int iFace = 0; iFace < (unsigned int)groupInfo.pcGroup->numtris;++iFace)  {
            // check range
            unsigned int iMatIndex = groupData.pcFaces[iFace].iMatIndex[0];
            if (iMatIndex >= iNumMaterials) {
                // sometimes MED writes -1, but normally only if there is only
                // one skin assigned. No warning in this case
                if(UINT_MAX != iMatIndex)
                    ASSIMP_LOG_WARN("Index overflow in MDL7 material list [#1]");
                iMatIndex = iNumMaterials-1;
            }
            unsigned int iMatIndex2 = groupData.pcFaces[iFace].iMatIndex[1];

            unsigned int iNum = iMatIndex;
            if (UINT_MAX != iMatIndex2 && iMatIndex != iMatIndex2)  {
                if (iMatIndex2 >= iNumMaterials)    {
                    // sometimes MED writes -1, but normally only if there is only
                    // one skin assigned. No warning in this case
                    ASSIMP_LOG_WARN("Index overflow in MDL7 material list [#2]");
                    iMatIndex2 = iNumMaterials-1;
                }

                // do a slow search in the list ...
                iNum = 0;
                bool bFound = false;
                for (std::vector<MDL::IntMaterial_MDL7>::iterator i =  avMats.begin();i != avMats.end();++i,++iNum){
                    if ((*i).iOldMatIndices[0] == iMatIndex && (*i).iOldMatIndices[1] == iMatIndex2)    {
                        // reuse this material
                        bFound = true;
                        break;
                    }
                }
                if (!bFound)    {
                    //  build a new material ...
                    MDL::IntMaterial_MDL7 sHelper;
                    sHelper.pcMat = new aiMaterial();
                    sHelper.iOldMatIndices[0] = iMatIndex;
                    sHelper.iOldMatIndices[1] = iMatIndex2;
                    JoinSkins_3DGS_MDL7(splitGroupData.shared.pcMats[iMatIndex],
                        splitGroupData.shared.pcMats[iMatIndex2],sHelper.pcMat);

                    // and add it to the list
                    avMats.push_back(sHelper);
                    iNum = (unsigned int)avMats.size()-1;
                }
                // adjust the size of the file array
                if (iNum == aiTempSplit.size()) {
                    aiTempSplit.push_back(new std::vector<unsigned int>());
                }
            }
            aiTempSplit[iNum]->push_back(iFace);
        }

        // now add the newly created materials to the old list
        if (0 == groupInfo.iIndex)  {
            splitGroupData.shared.pcMats.resize(avMats.size());
            for (unsigned int o = 0; o < avMats.size();++o)
                splitGroupData.shared.pcMats[o] = avMats[o].pcMat;
        }
        else    {
            // This might result in redundant materials ...
            splitGroupData.shared.pcMats.resize(iNumMaterials + avMats.size());
            for (unsigned int o = iNumMaterials; o < avMats.size();++o)
                splitGroupData.shared.pcMats[o] = avMats[o].pcMat;
        }

        // and build the final face-to-material array
        splitGroupData.aiSplit = new std::vector<unsigned int>*[aiTempSplit.size()];
        for (unsigned int m = 0; m < iNumMaterials;++m)
            splitGroupData.aiSplit[m] = aiTempSplit[m];
    }
}